

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O2

bool tinyusdz::detail::ParseMaterialXValue(string *typeName,string *str,Value *value,string *err)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  string *args;
  StreamReader sr;
  ostringstream ss_e_1;
  AsciiParser parser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_6a8;
  StreamReader local_688;
  string local_668 [11];
  AsciiParser local_4f0;
  
  args = err;
  bVar1 = is_supported_type(typeName);
  if (bVar1) {
    local_688.binary_ = (uint8_t *)(str->_M_dataplus)._M_p;
    local_688.length_ = str->_M_string_length;
    local_688.swap_endian_ = false;
    local_688.idx_ = 0;
    ascii::AsciiParser::AsciiParser(&local_4f0,&local_688);
    iVar2 = ::std::__cxx11::string::compare((char *)typeName);
    if (iVar2 == 0) {
      ParseValue<int>(&local_4f0,(int *)local_668,err);
    }
    else {
      iVar2 = ::std::__cxx11::string::compare((char *)typeName);
      if (iVar2 == 0) {
        ParseValue<bool>(&local_4f0,(bool *)local_668,err);
      }
      else {
        iVar2 = ::std::__cxx11::string::compare((char *)typeName);
        if (iVar2 == 0) {
          ParseValue<std::array<float,2ul>>(&local_4f0,(float2 *)local_668,err);
        }
        else {
          iVar2 = ::std::__cxx11::string::compare((char *)typeName);
          if (iVar2 == 0) {
            ParseValue<std::array<float,3ul>>(&local_4f0,(float3 *)local_668,err);
          }
          else {
            iVar2 = ::std::__cxx11::string::compare((char *)typeName);
            if (iVar2 == 0) {
              ParseValue<std::array<float,4ul>>(&local_4f0,(float4 *)local_668,err);
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_668);
              poVar3 = ::std::operator<<((ostream *)local_668,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseMaterialXValue");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x16f);
              ::std::operator<<(poVar3," ");
              ::std::operator+(&bStack_6a8,"TODO: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               typeName);
              poVar3 = ::std::operator<<((ostream *)local_668,(string *)&bStack_6a8);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::_M_dispose();
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::append((string *)err);
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_668);
            }
          }
        }
      }
    }
    ascii::AsciiParser::~AsciiParser(&local_4f0);
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4f0);
    poVar3 = ::std::operator<<((ostream *)&local_4f0,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"ParseMaterialXValue");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x14e);
    ::std::operator<<(poVar3," ");
    ::std::__cxx11::string::string
              ((string *)&local_688,"Invalid/unsupported type: {}",(allocator *)&bStack_6a8);
    fmt::format<std::__cxx11::string>
              (local_668,(fmt *)&local_688,(string *)typeName,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    poVar3 = ::std::operator<<((ostream *)&local_4f0,(string *)local_668);
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_4f0);
  }
  return false;
}

Assistant:

bool ParseMaterialXValue(const std::string &typeName, const std::string &str,
                         value::Value *value, std::string *err) {
  (void)value;

  if (!is_supported_type(typeName)) {
    PUSH_ERROR_AND_RETURN(
        fmt::format("Invalid/unsupported type: {}", typeName));
  }

  tinyusdz::StreamReader sr(reinterpret_cast<const uint8_t *>(str.data()),
                            str.size(), /* swap endian */ false);
  tinyusdz::ascii::AsciiParser parser(&sr);

  if (typeName.compare("integer") == 0) {
    int val;
    if (!ParseValue(parser, val, err)) {
      return false;
    }
  } else if (typeName.compare("boolean") == 0) {
    bool val;
    if (!ParseValue(parser, val, err)) {
      return false;
    }
  } else if (typeName.compare("vector2") == 0) {
    value::float2 val;
    if (!ParseValue(parser, val, err)) {
      return false;
    }
  } else if (typeName.compare("vector3") == 0) {
    value::float3 val;
    if (!ParseValue(parser, val, err)) {
      return false;
    }
  } else if (typeName.compare("vector4") == 0) {
    value::float4 val;
    if (!ParseValue(parser, val, err)) {
      return false;
    }
  } else {
    PUSH_ERROR_AND_RETURN("TODO: " + typeName);
  }

  // TODO
  return false;
}